

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O0

obj * __thiscall
VW::object_pool<obj,_obj_initializer>::get_object(object_pool<obj,_obj_initializer> *this)

{
  bool bVar1;
  reference ppoVar2;
  value_type obj;
  object_pool<obj,_obj_initializer> *in_stack_00000030;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  unique_lock<std::mutex> *this_00;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = std::queue<obj_*,_std::deque<obj_*,_std::allocator<obj_*>_>_>::empty
                    ((queue<obj_*,_std::deque<obj_*,_std::allocator<obj_*>_>_> *)0x1b902b);
  if (bVar1) {
    new_chunk(in_stack_00000030,(size_t)obj);
  }
  ppoVar2 = std::queue<obj_*,_std::deque<obj_*,_std::allocator<obj_*>_>_>::front
                      ((queue<obj_*,_std::deque<obj_*,_std::allocator<obj_*>_>_> *)0x1b9078);
  this_00 = (unique_lock<std::mutex> *)*ppoVar2;
  std::queue<obj_*,_std::deque<obj_*,_std::allocator<obj_*>_>_>::pop
            ((queue<obj_*,_std::deque<obj_*,_std::allocator<obj_*>_>_> *)0x1b909a);
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return (obj *)this_00;
}

Assistant:

T* get_object()
  {
    std::unique_lock<std::mutex> lock(m_lock);
    if (m_pool.empty())
    {
      new_chunk(m_chunk_size);
    }

    auto obj = m_pool.front();
    m_pool.pop();
    return obj;
  }